

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ExpectationBase * __thiscall
testing::internal::FunctionMocker<void_(solitaire::piles::PileId,_unsigned_int)>::
UntypedFindMatchingExpectation
          (FunctionMocker<void_(solitaire::piles::PileId,_unsigned_int)> *this,void *untyped_args,
          void **untyped_action,bool *is_excessive,ostream *what,ostream *why)

{
  element_type *peVar1;
  int iVar2;
  TypedExpectation<void_(solitaire::piles::PileId,_unsigned_int)> *this_00;
  Action<void_(solitaire::piles::PileId,_unsigned_int)> *pAVar3;
  
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  this_00 = FindMatchingExpectationLocked(this,(ArgumentTuple *)untyped_args);
  if (this_00 == (TypedExpectation<void_(solitaire::piles::PileId,_unsigned_int)> *)0x0) {
    FormatUnexpectedCallMessageLocked(this,(ArgumentTuple *)untyped_args,what,why);
  }
  else {
    MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
    peVar1 = (this_00->super_ExpectationBase).cardinality_.impl_.
             super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar2 = (*peVar1->_vptr_CardinalityInterface[5])
                      (peVar1,(ulong)(uint)(this_00->super_ExpectationBase).call_count_);
    *is_excessive = SUB41(iVar2,0);
    pAVar3 = TypedExpectation<void_(solitaire::piles::PileId,_unsigned_int)>::GetActionForArguments
                       (this_00,this,(ArgumentTuple *)untyped_args,what,why);
    if (pAVar3 == (Action<void_(solitaire::piles::PileId,_unsigned_int)> *)0x0) {
      pAVar3 = (Action<void_(solitaire::piles::PileId,_unsigned_int)> *)0x0;
    }
    else if ((pAVar3->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
      pAVar3 = (Action<void_(solitaire::piles::PileId,_unsigned_int)> *)0x0;
    }
    *untyped_action = pAVar3;
  }
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  return &this_00->super_ExpectationBase;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    MutexLock l(&g_gmock_mutex);
    TypedExpectation<F>* exp = this->FindMatchingExpectationLocked(args);
    if (exp == nullptr) {  // A match wasn't found.
      this->FormatUnexpectedCallMessageLocked(args, what, why);
      return nullptr;
    }

    // This line must be done before calling GetActionForArguments(),
    // which will increment the call count for *exp and thus affect
    // its saturation status.
    *is_excessive = exp->IsSaturated();
    const Action<F>* action = exp->GetActionForArguments(this, args, what, why);
    if (action != nullptr && action->IsDoDefault())
      action = nullptr;  // Normalize "do default" to NULL.
    *untyped_action = action;
    return exp;
  }